

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

channel_s * fio_channel_find_dup(fio_str_info_s name)

{
  uint64_t hashed;
  channel_s *pcVar1;
  channel_s *ch;
  uint64_t hashed_name;
  channel_s tmp;
  
  memset(&hashed_name,0,0x40);
  hashed_name = name.capa;
  tmp.name_len = name.len;
  hashed = fio_siphash13((void *)name.len,name.capa,0x1bac58,0x1bac58);
  pcVar1 = fio_channel_find_dup_internal((channel_s *)&hashed_name,hashed,&fio_postoffice.pubsub);
  return pcVar1;
}

Assistant:

static channel_s *fio_channel_find_dup(fio_str_info_s name) {
  channel_s tmp = {.name = name.data, .name_len = name.len};
  uint64_t hashed_name = FIO_HASH_FN(
      name.data, name.len, &fio_postoffice.pubsub, &fio_postoffice.pubsub);
  channel_s *ch =
      fio_channel_find_dup_internal(&tmp, hashed_name, &fio_postoffice.pubsub);
  return ch;
}